

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult * __thiscall
testing::internal::CmpHelperEQFailure<std::__cxx11::string,char[10]>
          (AssertionResult *__return_storage_ptr__,internal *this,char *lhs_expression,
          char *rhs_expression,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,char (*rhs) [10])

{
  string local_70;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  char (*rhs_local) [10];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs_local;
  char *rhs_expression_local;
  char *lhs_expression_local;
  
  local_30 = lhs;
  rhs_local = (char (*) [10])rhs_expression;
  lhs_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lhs_expression;
  rhs_expression_local = (char *)this;
  lhs_expression_local = &__return_storage_ptr__->success_;
  FormatForComparisonFailureMessage<std::__cxx11::string,char[10]>
            (&local_50,(internal *)rhs_expression,lhs,(char (*) [10])rhs_expression);
  FormatForComparisonFailureMessage<char[10],std::__cxx11::string>
            (&local_70,(internal *)local_30,rhs_local,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rhs_expression);
  testing::internal::EqFailure
            (&__return_storage_ptr__->success_,(char *)this,(string *)lhs_expression,
             (string *)&local_50,SUB81(&local_70,0));
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

AssertionResult CmpHelperEQFailure(const char* lhs_expression,
                                   const char* rhs_expression,
                                   const T1& lhs, const T2& rhs) {
  return EqFailure(lhs_expression,
                   rhs_expression,
                   FormatForComparisonFailureMessage(lhs, rhs),
                   FormatForComparisonFailureMessage(rhs, lhs),
                   false);
}